

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Order.cpp
# Opt level: O0

Order * __thiscall Order::operator=(Order *this,Order *assignOrder)

{
  Order *assignOrder_local;
  Order *this_local;
  
  this->m_seqId = assignOrder->m_seqId;
  this->m_actionType = assignOrder->m_actionType;
  this->m_orderId = assignOrder->m_orderId;
  this->m_orderSide = assignOrder->m_orderSide;
  this->m_orderQty = assignOrder->m_orderQty;
  this->m_orderPrice = assignOrder->m_orderPrice;
  return this;
}

Assistant:

Order& Order::operator=(const Order& assignOrder)
{
	m_seqId = assignOrder.m_seqId;
	m_actionType = assignOrder.m_actionType;
	m_orderId = assignOrder.m_orderId;
	m_orderSide = assignOrder.m_orderSide;
	m_orderQty = assignOrder.m_orderQty;
	m_orderPrice = assignOrder.m_orderPrice;
	return(*this);
}